

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  uint32_t *__a;
  uint32_t *__b;
  string *psVar1;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FileDescriptorProto *other_local;
  FileDescriptorProto *this_local;
  
  rhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  lhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)other);
  internal::InternalMetadata::InternalSwap
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(other->super_Message).super_MessageLite._internal_metadata_);
  __a = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  __b = internal::HasBits<1UL>::operator[](&other->_has_bits_,0);
  std::swap<unsigned_int>(__a,__b);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap(&this->dependency_,&other->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::InternalSwap
            (&this->message_type_,&other->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::InternalSwap
            (&this->enum_type_,&other->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::InternalSwap
            (&this->service_,&other->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::InternalSwap
            (&this->extension_,&other->extension_);
  RepeatedField<int>::InternalSwap(&this->public_dependency_,&other->public_dependency_);
  RepeatedField<int>::InternalSwap(&this->weak_dependency_,&other->weak_dependency_);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->name_,rhs_arena_00,&other->name_,lhs_arena_00);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->package_,rhs_arena_00,&other->package_,lhs_arena_00);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->syntax_,rhs_arena_00,&other->syntax_,lhs_arena_00);
  internal::memswap<16>((char *)&this->options_,(char *)&other->options_);
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &name_, lhs_arena,
      &other->name_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &package_, lhs_arena,
      &other->package_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &syntax_, lhs_arena,
      &other->syntax_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileDescriptorProto, source_code_info_)
      + sizeof(FileDescriptorProto::source_code_info_)
      - PROTOBUF_FIELD_OFFSET(FileDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}